

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysAllocService.cpp
# Opt level: O3

void * anon_unknown.dwarf_645b92::cali_malloc_wrapper(size_t size)

{
  int iVar1;
  bool bVar2;
  code *pcVar3;
  void *ptr;
  int *piVar4;
  Channel *this;
  Caliper c;
  size_t local_58;
  Caliper local_50;
  
  pcVar3 = (code *)gotcha_get_wrappee((anonymous_namespace)::orig_malloc_handle);
  ptr = (void *)(*pcVar3)();
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  if ((anonymous_namespace)::sysalloc_channels != (Channel *)0x0) {
    this = (anonymous_namespace)::sysalloc_channels;
    do {
      cali::Caliper::sigsafe_instance();
      bVar2 = cali::Caliper::operator_cast_to_bool(&local_50);
      if (bVar2) {
        bVar2 = cali::Channel::is_active(this);
        if (bVar2) {
          cali::Caliper::memory_region_begin
                    (&local_50,
                     (this->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,ptr,"malloc",1,1,&local_58,0,(Attribute *)0x0,(Variant *)0x0);
        }
      }
      this = (Channel *)
             this[1].mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    } while (this != (Channel *)0x0);
  }
  *piVar4 = iVar1;
  return ptr;
}

Assistant:

void* cali_malloc_wrapper(size_t size)
{
    decltype(&std::malloc) orig_malloc =
        reinterpret_cast<decltype(&std::malloc)>(gotcha_get_wrappee(orig_malloc_handle));

    void* ret = (*orig_malloc)(size);

    int saved_errno = errno;

    for (ChannelList* p = sysalloc_channels; p; p = p->next) {
        Caliper c = Caliper::sigsafe_instance(); // prevent reentry

        if (c && p->channel.is_active())
            c.memory_region_begin(p->channel.body(), ret, "malloc", 1, 1, &size);
    }

    errno = saved_errno;

    return ret;
}